

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.impl.hpp
# Opt level: O2

matrixOps * __thiscall
pobr::imgProcessing::utils::matrixOps::applyKernel<cv::Vec<unsigned_char,3>,double,double>
          (matrixOps *this,Mat *img,Mat *kernel,double accumulatorInit,
          function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
          *reducer,function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
                   *applicator)

{
  uint kernelOffsetX;
  uint kernelOffsetY;
  uint endCol;
  uint endRow;
  uint initCol;
  uint initRow;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_b8;
  double accumulatorInit_local;
  anon_class_96_12_04f0a8a3 local_90;
  
  accumulatorInit_local = accumulatorInit;
  cv::Mat::clone();
  kernelOffsetY = (*(int *)(kernel + 8) + -1) / 2;
  local_90.initRow = &initRow;
  kernelOffsetX = (*(int *)(kernel + 0xc) + -1) / 2;
  local_90.initCol = &initCol;
  endRow = ~kernelOffsetY + *(int *)(img + 8);
  local_90.endRow = &endRow;
  endCol = ~kernelOffsetX + *(int *)(img + 0xc);
  local_90.endCol = &endCol;
  local_90.kernelOffsetY = &kernelOffsetY;
  local_90.kernelOffsetX = &kernelOffsetX;
  initCol = kernelOffsetX;
  initRow = kernelOffsetY;
  local_90.kernel = kernel;
  local_90.accumulatorInit = &accumulatorInit_local;
  local_90.img = img;
  local_90.reducer = reducer;
  local_90.resultImg = (Mat *)this;
  local_90.applicator = applicator;
  std::function<void(unsigned_long_const&,unsigned_long_const&)>::
  function<pobr::imgProcessing::utils::matrixOps::applyKernel<cv::Vec<unsigned_char,3>,double,double>(cv::Mat_const&,cv::Mat_const&,double,std::function<double(unsigned_long_const&,unsigned_long_const&,double&,cv::Vec<unsigned_char,3>const&,double_const&)>const&,std::function<void(unsigned_long_const&,unsigned_long_const&,double&,cv::Vec<unsigned_char,3>&,cv::Mat_const&)>const&)::_lambda(unsigned_long_const&,unsigned_long_const&)_1_,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&)> *)&local_b8,&local_90);
  forEachPixel((Mat *)this,&local_b8);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  return this;
}

Assistant:

cv::Mat
matrixOps::applyKernel(
    const cv::Mat& img,
    const cv::Mat& kernel,
    Acc accumulatorInit,
    const std::function<Acc(const uint64_t& x, const uint64_t& y, Acc& accumulator, const PixelClass& pixel, const KernelValue& kernelValue)>& reducer,
    const std::function<void(const uint64_t& x, const uint64_t& y, Acc& accumulator, PixelClass& pixel, const cv::Mat& img)>& applicator
)
{
    // Uses edge cropping
    auto resultImg = img.clone();

    const unsigned int initRow = 0 + ((kernel.rows - 1) / 2);
    const unsigned int initCol = 0 + ((kernel.cols - 1) / 2);

    const unsigned int endRow = (img.rows - 1) - initRow;
    const unsigned int endCol = (img.cols - 1) - initCol;

    const unsigned int kernelOffsetY = 0 + ((kernel.rows - 1) / 2);
    const unsigned int kernelOffsetX = 0 + ((kernel.cols - 1) / 2);

    matrixOps::forEachPixel(
        resultImg,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            if (x < initCol) {
                return;
            }
            if (y < initRow) {
                return;
            }
            if (x > endCol) {
                return;
            }
            if (y > endRow) {
                return;
            }

            Acc value = matrixOps::reduceEachPixel<Acc>(
                kernel,
                accumulatorInit,
                [&](const uint64_t& kernelX, const uint64_t& kernelY, Acc& accumulator) -> Acc
                {
                    auto& thisKernelValue = kernel.at<KernelValue>(kernelY, kernelX);
                    auto& adjacentPixel = img.at<PixelClass>(
                        y - kernelOffsetY + kernelY,
                        x - kernelOffsetX + kernelX
                    );

                    return reducer(x, y, accumulator, adjacentPixel, thisKernelValue);
                }
            );

            auto& thisPixel = resultImg.at<PixelClass>(y, x);

            applicator(x, y, value, thisPixel, img);
        }
    );

    return resultImg;
}